

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

bool ImGui::TabItemEx(ImGuiTabBar *tab_bar,char *label,bool *p_open,ImGuiTabItemFlags flags)

{
  ImVec2 *pIVar1;
  ImGuiWindow *pIVar2;
  ImVec2 IVar3;
  ImGuiContext *pIVar4;
  ImU32 IVar5;
  int iVar6;
  char *pcVar7;
  uint in_ECX;
  byte *in_RDX;
  ImRect *in_RSI;
  ImGuiTabBar *in_RDI;
  bool bVar8;
  undefined1 uVar9;
  byte bVar10;
  float _x;
  ImVec2 IVar11;
  ImVec2 IVar12;
  ImVec2 bb_00;
  bool just_closed;
  ImGuiID close_button_id;
  bool hovered_unblocked;
  ImU32 tab_col;
  ImDrawList *display_draw_list;
  bool pressed;
  bool held;
  bool hovered;
  ImGuiButtonFlags button_flags;
  ImVec2 backup_cursor_max_pos;
  bool want_clip_rect;
  ImRect bb;
  ImVec2 pos;
  ImVec2 backup_main_cursor_pos;
  bool tab_contents_visible;
  bool tab_appearing;
  bool tab_bar_focused;
  bool tab_bar_appearing;
  bool tab_is_new;
  ImGuiTabItem *tab;
  ImVec2 size;
  ImGuiID id;
  ImGuiStyle *style;
  ImGuiWindow *window;
  ImGuiContext *g;
  undefined4 in_stack_fffffffffffffe88;
  float in_stack_fffffffffffffe8c;
  ImGuiHoveredFlags in_stack_fffffffffffffe90;
  ImGuiItemFlags in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  undefined1 repeat;
  ImGuiMouseButton button;
  ImVector<ImGuiTabItem> *in_stack_fffffffffffffea0;
  ImRect *pIVar13;
  ImRect *in_stack_fffffffffffffea8;
  ImRect *pIVar14;
  undefined4 in_stack_fffffffffffffeb0;
  ImGuiID in_stack_fffffffffffffeb4;
  ImGuiID id_00;
  char cVar15;
  ImRect *in_stack_fffffffffffffeb8;
  ImRect *bb_01;
  ImVec2 *pIVar16;
  ImGuiButtonFlags flags_00;
  ImGuiTabBar *in_stack_fffffffffffffed0;
  bool *in_stack_fffffffffffffed8;
  ImGuiID in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  byte local_106;
  ImVec2 local_ec;
  float in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff24;
  uint flags_01;
  float in_stack_ffffffffffffff30;
  float in_stack_ffffffffffffff34;
  float in_stack_ffffffffffffff38;
  float in_stack_ffffffffffffff3c;
  ImVec2 bb_02;
  undefined1 in_stack_ffffffffffffff4f;
  ImGuiTabItemFlags in_stack_ffffffffffffff64;
  ImRect *in_stack_ffffffffffffff68;
  byte bVar17;
  byte bVar18;
  ImGuiID in_stack_ffffffffffffff74;
  ImVec2 in_stack_ffffffffffffff7c;
  ImGuiTabItem *local_68;
  float local_5c;
  ImGuiTabBar *in_stack_ffffffffffffffb0;
  uint local_24;
  byte *local_20;
  bool local_1;
  
  if ((in_RDI->WantLayout & 1U) != 0) {
    TabBarLayout(in_stack_ffffffffffffffb0);
  }
  pIVar4 = GImGui;
  pIVar2 = GImGui->CurrentWindow;
  if ((pIVar2->SkipItems & 1U) == 0) {
    IVar5 = TabBarCalcTabID((ImGuiTabBar *)
                            CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                            (char *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    if ((in_RDX == (byte *)0x0) || ((*in_RDX & 1) != 0)) {
      local_24 = in_ECX;
      if ((in_ECX & 0x100000) == 0) {
        local_20 = in_RDX;
        if (in_RDX == (byte *)0x0) {
          local_24 = in_ECX | 0x100000;
        }
      }
      else {
        local_20 = (byte *)0x0;
      }
      IVar11 = TabItemCalcSize((char *)in_stack_fffffffffffffea8,
                               SUB81((ulong)in_stack_fffffffffffffea0 >> 0x38,0));
      local_68 = TabBarFindTabByID((ImGuiTabBar *)
                                   CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
      bVar8 = local_68 == (ImGuiTabItem *)0x0;
      local_5c = IVar11.x;
      if (bVar8) {
        in_stack_fffffffffffffed0 = in_RDI;
        ImGuiTabItem::ImGuiTabItem((ImGuiTabItem *)&stack0xffffffffffffff74);
        ImVector<ImGuiTabItem>::push_back
                  ((ImVector<ImGuiTabItem> *)
                   CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                   (ImGuiTabItem *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        local_68 = ImVector<ImGuiTabItem>::back
                             ((ImVector<ImGuiTabItem> *)
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        local_68->ID = IVar5;
        local_68->Width = local_5c;
      }
      iVar6 = ImVector<ImGuiTabItem>::index_from_ptr
                        (in_stack_fffffffffffffea0,
                         (ImGuiTabItem *)
                         CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
      in_RDI->LastTabItemIdx = (short)iVar6;
      local_68->ContentWidth = local_5c;
      bVar18 = in_RDI->PrevFrameVisible + 1 < pIVar4->FrameCount;
      uVar9 = (in_RDI->Flags & 0x200000U) != 0;
      bVar17 = local_68->LastFrameVisible + 1 < pIVar4->FrameCount;
      local_68->LastFrameVisible = pIVar4->FrameCount;
      local_68->Flags = local_24;
      iVar6 = ImGuiTextBuffer::size(&in_RDI->TabsNames);
      local_68->NameOffset = iVar6;
      pIVar16 = (ImVec2 *)&in_RDI->TabsNames;
      bb_01 = in_RSI;
      pIVar14 = in_RSI;
      strlen((char *)in_RSI);
      flags_00 = (ImGuiButtonFlags)((ulong)pIVar14 >> 0x20);
      ImGuiTextBuffer::append
                ((ImGuiTextBuffer *)pIVar16,(char *)bb_01,
                 (char *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0));
      if (((bVar17 & 1) == 0) && ((in_RDI->Flags & 1U) == 0)) {
        local_68->Offset = in_RDI->OffsetNextTab;
        in_RDI->OffsetNextTab =
             local_68->Width + (pIVar4->Style).ItemInnerSpacing.x + in_RDI->OffsetNextTab;
      }
      if (((((bVar17 & 1) != 0) && ((in_RDI->Flags & 2U) != 0)) && (in_RDI->NextSelectedTabId == 0))
         && (((bVar18 & 1) == 0 || (in_RDI->SelectedTabId == 0)))) {
        in_RDI->NextSelectedTabId = IVar5;
      }
      if (((local_24 & 2) != 0) && (in_RDI->SelectedTabId != IVar5)) {
        in_RDI->NextSelectedTabId = IVar5;
      }
      bVar10 = in_RDI->VisibleTabId == IVar5;
      if ((bool)bVar10) {
        in_RDI->VisibleTabWasSubmitted = true;
      }
      else if ((((in_RDI->SelectedTabId == 0) && ((bVar18 & 1) != 0)) && ((in_RDI->Tabs).Size == 1))
              && ((in_RDI->Flags & 2U) == 0)) {
        bVar10 = true;
      }
      if (((bVar17 & 1) == 0) || (((bVar18 & 1) != 0 && (!bVar8)))) {
        if (in_RDI->SelectedTabId == IVar5) {
          local_68->LastFrameSelected = pIVar4->FrameCount;
        }
        IVar11 = (pIVar2->DC).CursorPos;
        pIVar13 = &in_RDI->BarRect;
        pIVar14 = (ImRect *)&stack0xffffffffffffff48;
        ImVec2::ImVec2((ImVec2 *)pIVar14,(float)(int)(local_68->Offset - in_RDI->ScrollingAnim),0.0)
        ;
        IVar12 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                             ,(ImVec2 *)0x2cd941);
        (pIVar2->DC).CursorPos = IVar12;
        bb_02 = (pIVar2->DC).CursorPos;
        bb_00 = ::operator+((ImVec2 *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),
                            (ImVec2 *)0x2cd98d);
        ImRect::ImRect((ImRect *)&stack0xffffffffffffff30,(ImVec2 *)&stack0xffffffffffffff40,
                       (ImVec2 *)&stack0xffffffffffffff28);
        id_00 = CONCAT13(1,(int3)in_stack_fffffffffffffeb4);
        if ((in_RDI->BarRect).Min.x <= in_stack_ffffffffffffff30) {
          pIVar1 = &(in_RDI->BarRect).Max;
          id_00 = CONCAT13(pIVar1->x <= in_stack_ffffffffffffff38 &&
                           in_stack_ffffffffffffff38 != pIVar1->x,(int3)in_stack_fffffffffffffeb4);
        }
        cVar15 = (char)(id_00 >> 0x18);
        flags_01 = CONCAT13(cVar15,(int3)in_stack_ffffffffffffff24);
        if (cVar15 != '\0') {
          _x = ImMax<float>(in_stack_ffffffffffffff30,(in_RDI->BarRect).Min.x);
          ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffff1c,_x,in_stack_ffffffffffffff34 - 1.0);
          ImVec2::ImVec2(&local_ec,(in_RDI->BarRect).Max.x,in_stack_ffffffffffffff3c);
          PushClipRect(pIVar16,&bb_01->Min,SUB41(id_00 >> 0x18,0));
        }
        IVar3 = (pIVar2->DC).CursorMaxPos;
        ImRect::GetSize((ImRect *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88));
        ItemSize((ImVec2 *)CONCAT44(id_00,in_stack_fffffffffffffeb0),(float)((ulong)pIVar14 >> 0x20)
                );
        (pIVar2->DC).CursorMaxPos = IVar3;
        bVar8 = ItemAdd(bb_01,id_00,pIVar14);
        if (bVar8) {
          bVar8 = ButtonBehavior((ImRect *)
                                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8),
                                 in_stack_fffffffffffffee4,in_stack_fffffffffffffed8,
                                 (bool *)in_stack_fffffffffffffed0,flags_00);
          if (bVar8) {
            in_RDI->NextSelectedTabId = IVar5;
          }
          if ((local_106 & 1) == 0) {
            SetItemAllowOverlap();
          }
          if ((((local_106 & 1) != 0) && ((bVar17 & 1) == 0)) &&
             ((bVar8 = IsMouseDragging(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8c), bVar8
              && (((pIVar4->DragDropActive & 1U) == 0 && ((in_RDI->Flags & 1U) != 0)))))) {
            pIVar16 = &(pIVar4->IO).MouseDelta;
            if ((0.0 < pIVar16->x || pIVar16->x == 0.0) ||
               (in_stack_ffffffffffffff30 <= (pIVar4->IO).MousePos.x)) {
              if (((0.0 < (pIVar4->IO).MouseDelta.x) &&
                  (in_stack_ffffffffffffff38 < (pIVar4->IO).MousePos.x)) &&
                 ((in_RDI->Flags & 1U) != 0)) {
                TabBarQueueChangeTabOrder
                          ((ImGuiTabBar *)
                           CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                           (ImGuiTabItem *)
                           CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
              }
            }
            else if ((in_RDI->Flags & 1U) != 0) {
              TabBarQueueChangeTabOrder
                        ((ImGuiTabBar *)
                         CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                         (ImGuiTabItem *)
                         CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88),0);
            }
          }
          repeat = 0;
          GetColorU32((ImGuiCol)((ulong)pIVar13 >> 0x20),SUB84(pIVar13,0));
          button = (ImGuiMouseButton)pIVar13;
          TabItemBackground((ImDrawList *)
                            CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                            (ImRect *)bb_00,flags_01,(ImU32)in_stack_ffffffffffffff20);
          RenderNavHighlight((ImRect *)bb_02,(ImGuiID)in_stack_ffffffffffffff3c,
                             (ImGuiNavHighlightFlags)in_stack_ffffffffffffff38);
          bVar8 = IsItemHovered(in_stack_fffffffffffffe90);
          if ((bVar8) &&
             ((bVar8 = IsMouseClicked(button,(bool)repeat), bVar8 ||
              (bVar8 = IsMouseReleased(in_stack_fffffffffffffe94), bVar8)))) {
            in_RDI->NextSelectedTabId = IVar5;
          }
          if (local_20 != (byte *)0x0) {
            ImGuiWindow::GetID((ImGuiWindow *)
                               CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                               (void *)CONCAT44(in_stack_fffffffffffffe8c,in_stack_fffffffffffffe88)
                              );
          }
          bVar8 = TabItemLabelAndCloseButton
                            ((ImDrawList *)
                             CONCAT44(in_stack_ffffffffffffff74,
                                      CONCAT13(bVar18,CONCAT12(uVar9,CONCAT11(bVar17,bVar10)))),
                             in_stack_ffffffffffffff68,in_stack_ffffffffffffff64,
                             in_stack_ffffffffffffff7c,(char *)IVar11,(ImGuiID)IVar12.y,
                             (ImGuiID)IVar12.x,(bool)in_stack_ffffffffffffff4f);
          if ((bVar8) && (local_20 != (byte *)0x0)) {
            *local_20 = 0;
            TabBarCloseTab(in_RDI,local_68);
          }
          if ((flags_01 & 0x1000000) != 0) {
            PopClipRect();
          }
          (pIVar2->DC).CursorPos = IVar11;
          if ((((pIVar4->HoveredId == IVar5) && ((local_106 & 1) == 0)) &&
              (0.5 < pIVar4->HoveredIdNotActiveTimer)) &&
             (((bVar8 = IsItemHovered(in_stack_fffffffffffffe90), bVar8 &&
               ((in_RDI->Flags & 0x20U) == 0)) && ((local_68->Flags & 0x10U) == 0)))) {
            pcVar7 = FindRenderedTextEnd((char *)in_RSI,(char *)0x0);
            SetTooltip("%.*s",(ulong)(uint)((int)pcVar7 - (int)in_RSI),in_RSI);
          }
          local_1 = (bool)(bVar10 & 1);
        }
        else {
          if ((flags_01 & 0x1000000) != 0) {
            PopClipRect();
          }
          (pIVar2->DC).CursorPos = IVar11;
          local_1 = (bool)(bVar10 & 1);
        }
      }
      else {
        PushItemFlag(in_stack_fffffffffffffe94,SUB41((uint)in_stack_fffffffffffffe90 >> 0x18,0));
        ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        ItemAdd(bb_01,in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8);
        PopItemFlag();
        local_1 = (bool)(bVar10 & 1);
      }
    }
    else {
      PushItemFlag(in_stack_fffffffffffffe94,SUB41((uint)in_stack_fffffffffffffe90 >> 0x18,0));
      ImRect::ImRect((ImRect *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
      ItemAdd(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb4,in_stack_fffffffffffffea8);
      PopItemFlag();
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool    ImGui::TabItemEx(ImGuiTabBar* tab_bar, const char* label, bool* p_open, ImGuiTabItemFlags flags)
{
    // Layout whole tab bar if not already done
    if (tab_bar->WantLayout)
        TabBarLayout(tab_bar);

    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    if (window->SkipItems)
        return false;

    const ImGuiStyle& style = g.Style;
    const ImGuiID id = TabBarCalcTabID(tab_bar, label);

    // If the user called us with *p_open == false, we early out and don't render. We make a dummy call to ItemAdd() so that attempts to use a contextual popup menu with an implicit ID won't use an older ID.
    IMGUI_TEST_ENGINE_ITEM_INFO(id, label, window->DC.LastItemStatusFlags);
    if (p_open && !*p_open)
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return false;
    }

    // Store into ImGuiTabItemFlags_NoCloseButton, also honor ImGuiTabItemFlags_NoCloseButton passed by user (although not documented)
    if (flags & ImGuiTabItemFlags_NoCloseButton)
        p_open = NULL;
    else if (p_open == NULL)
        flags |= ImGuiTabItemFlags_NoCloseButton;

    // Calculate tab contents size
    ImVec2 size = TabItemCalcSize(label, p_open != NULL);

    // Acquire tab data
    ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, id);
    bool tab_is_new = false;
    if (tab == NULL)
    {
        tab_bar->Tabs.push_back(ImGuiTabItem());
        tab = &tab_bar->Tabs.back();
        tab->ID = id;
        tab->Width = size.x;
        tab_is_new = true;
    }
    tab_bar->LastTabItemIdx = (short)tab_bar->Tabs.index_from_ptr(tab);
    tab->ContentWidth = size.x;

    const bool tab_bar_appearing = (tab_bar->PrevFrameVisible + 1 < g.FrameCount);
    const bool tab_bar_focused = (tab_bar->Flags & ImGuiTabBarFlags_IsFocused) != 0;
    const bool tab_appearing = (tab->LastFrameVisible + 1 < g.FrameCount);
    tab->LastFrameVisible = g.FrameCount;
    tab->Flags = flags;

    // Append name with zero-terminator
    tab->NameOffset = tab_bar->TabsNames.size();
    tab_bar->TabsNames.append(label, label + strlen(label) + 1);

    // If we are not reorderable, always reset offset based on submission order.
    // (We already handled layout and sizing using the previous known order, but sizing is not affected by order!)
    if (!tab_appearing && !(tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
    {
        tab->Offset = tab_bar->OffsetNextTab;
        tab_bar->OffsetNextTab += tab->Width + g.Style.ItemInnerSpacing.x;
    }

    // Update selected tab
    if (tab_appearing && (tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs) && tab_bar->NextSelectedTabId == 0)
        if (!tab_bar_appearing || tab_bar->SelectedTabId == 0)
            tab_bar->NextSelectedTabId = id;  // New tabs gets activated
    if ((flags & ImGuiTabItemFlags_SetSelected) && (tab_bar->SelectedTabId != id)) // SetSelected can only be passed on explicit tab bar
        tab_bar->NextSelectedTabId = id;

    // Lock visibility
    // (Note: tab_contents_visible != tab_selected... because CTRL+TAB operations may preview some tabs without selecting them!)
    bool tab_contents_visible = (tab_bar->VisibleTabId == id);
    if (tab_contents_visible)
        tab_bar->VisibleTabWasSubmitted = true;

    // On the very first frame of a tab bar we let first tab contents be visible to minimize appearing glitches
    if (!tab_contents_visible && tab_bar->SelectedTabId == 0 && tab_bar_appearing)
        if (tab_bar->Tabs.Size == 1 && !(tab_bar->Flags & ImGuiTabBarFlags_AutoSelectNewTabs))
            tab_contents_visible = true;

    // Note that tab_is_new is not necessarily the same as tab_appearing! When a tab bar stops being submitted
    // and then gets submitted again, the tabs will have 'tab_appearing=true' but 'tab_is_new=false'.
    if (tab_appearing && (!tab_bar_appearing || tab_is_new))
    {
        PushItemFlag(ImGuiItemFlags_NoNav | ImGuiItemFlags_NoNavDefaultFocus, true);
        ItemAdd(ImRect(), id);
        PopItemFlag();
        return tab_contents_visible;
    }

    if (tab_bar->SelectedTabId == id)
        tab->LastFrameSelected = g.FrameCount;

    // Backup current layout position
    const ImVec2 backup_main_cursor_pos = window->DC.CursorPos;

    // Layout
    size.x = tab->Width;
    window->DC.CursorPos = tab_bar->BarRect.Min + ImVec2(IM_FLOOR(tab->Offset - tab_bar->ScrollingAnim), 0.0f);
    ImVec2 pos = window->DC.CursorPos;
    ImRect bb(pos, pos + size);

    // We don't have CPU clipping primitives to clip the CloseButton (until it becomes a texture), so need to add an extra draw call (temporary in the case of vertical animation)
    bool want_clip_rect = (bb.Min.x < tab_bar->BarRect.Min.x) || (bb.Max.x > tab_bar->BarRect.Max.x);
    if (want_clip_rect)
        PushClipRect(ImVec2(ImMax(bb.Min.x, tab_bar->BarRect.Min.x), bb.Min.y - 1), ImVec2(tab_bar->BarRect.Max.x, bb.Max.y), true);

    ImVec2 backup_cursor_max_pos = window->DC.CursorMaxPos;
    ItemSize(bb.GetSize(), style.FramePadding.y);
    window->DC.CursorMaxPos = backup_cursor_max_pos;

    if (!ItemAdd(bb, id))
    {
        if (want_clip_rect)
            PopClipRect();
        window->DC.CursorPos = backup_main_cursor_pos;
        return tab_contents_visible;
    }

    // Click to Select a tab
    ImGuiButtonFlags button_flags = (ImGuiButtonFlags_PressedOnClick | ImGuiButtonFlags_AllowItemOverlap);
    if (g.DragDropActive)
        button_flags |= ImGuiButtonFlags_PressedOnDragDropHold;
    bool hovered, held;
    bool pressed = ButtonBehavior(bb, id, &hovered, &held, button_flags);
    if (pressed)
        tab_bar->NextSelectedTabId = id;
    hovered |= (g.HoveredId == id);

    // Allow the close button to overlap unless we are dragging (in which case we don't want any overlapping tabs to be hovered)
    if (!held)
        SetItemAllowOverlap();

    // Drag and drop: re-order tabs
    if (held && !tab_appearing && IsMouseDragging(0))
    {
        if (!g.DragDropActive && (tab_bar->Flags & ImGuiTabBarFlags_Reorderable))
        {
            // While moving a tab it will jump on the other side of the mouse, so we also test for MouseDelta.x
            if (g.IO.MouseDelta.x < 0.0f && g.IO.MousePos.x < bb.Min.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, -1);
            }
            else if (g.IO.MouseDelta.x > 0.0f && g.IO.MousePos.x > bb.Max.x)
            {
                if (tab_bar->Flags & ImGuiTabBarFlags_Reorderable)
                    TabBarQueueChangeTabOrder(tab_bar, tab, +1);
            }
        }
    }

#if 0
    if (hovered && g.HoveredIdNotActiveTimer > 0.50f && bb.GetWidth() < tab->ContentWidth)
    {
        // Enlarge tab display when hovering
        bb.Max.x = bb.Min.x + IM_FLOOR(ImLerp(bb.GetWidth(), tab->ContentWidth, ImSaturate((g.HoveredIdNotActiveTimer - 0.40f) * 6.0f)));
        display_draw_list = GetForegroundDrawList(window);
        TabItemBackground(display_draw_list, bb, flags, GetColorU32(ImGuiCol_TitleBgActive));
    }
#endif

    // Render tab shape
    ImDrawList* display_draw_list = window->DrawList;
    const ImU32 tab_col = GetColorU32((held || hovered) ? ImGuiCol_TabHovered : tab_contents_visible ? (tab_bar_focused ? ImGuiCol_TabActive : ImGuiCol_TabUnfocusedActive) : (tab_bar_focused ? ImGuiCol_Tab : ImGuiCol_TabUnfocused));
    TabItemBackground(display_draw_list, bb, flags, tab_col);
    RenderNavHighlight(bb, id);

    // Select with right mouse button. This is so the common idiom for context menu automatically highlight the current widget.
    const bool hovered_unblocked = IsItemHovered(ImGuiHoveredFlags_AllowWhenBlockedByPopup);
    if (hovered_unblocked && (IsMouseClicked(1) || IsMouseReleased(1)))
        tab_bar->NextSelectedTabId = id;

    if (tab_bar->Flags & ImGuiTabBarFlags_NoCloseWithMiddleMouseButton)
        flags |= ImGuiTabItemFlags_NoCloseWithMiddleMouseButton;

    // Render tab label, process close button
    const ImGuiID close_button_id = p_open ? window->GetID((void*)((intptr_t)id + 1)) : 0;
    bool just_closed = TabItemLabelAndCloseButton(display_draw_list, bb, flags, tab_bar->FramePadding, label, id, close_button_id, tab_contents_visible);
    if (just_closed && p_open != NULL)
    {
        *p_open = false;
        TabBarCloseTab(tab_bar, tab);
    }

    // Restore main window position so user can draw there
    if (want_clip_rect)
        PopClipRect();
    window->DC.CursorPos = backup_main_cursor_pos;

    // Tooltip (FIXME: Won't work over the close button because ItemOverlap systems messes up with HoveredIdTimer)
    // We test IsItemHovered() to discard e.g. when another item is active or drag and drop over the tab bar (which g.HoveredId ignores)
    if (g.HoveredId == id && !held && g.HoveredIdNotActiveTimer > 0.50f && IsItemHovered())
        if (!(tab_bar->Flags & ImGuiTabBarFlags_NoTooltip) && !(tab->Flags & ImGuiTabItemFlags_NoTooltip))
            SetTooltip("%.*s", (int)(FindRenderedTextEnd(label) - label), label);

    return tab_contents_visible;
}